

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_group_scrolled_end(nk_context *ctx)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_panel *pnVar3;
  nk_vec2 nVar4;
  float local_218;
  nk_vec2 panel_padding;
  nk_window pan;
  nk_rect clip;
  nk_panel *g;
  nk_panel *parent;
  nk_window *win;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5629,"void nk_group_scrolled_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x562a,"void nk_group_scrolled_end(struct nk_context *)");
  }
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    if (ctx->current == (nk_window *)0x0) {
      __assert_fail("ctx->current",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x562f,"void nk_group_scrolled_end(struct nk_context *)");
    }
    pnVar1 = ctx->current;
    if (pnVar1->layout == (nk_panel *)0x0) {
      __assert_fail("win->layout",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x5631,"void nk_group_scrolled_end(struct nk_context *)");
    }
    pnVar2 = pnVar1->layout;
    if (pnVar2->parent == (nk_panel *)0x0) {
      __assert_fail("g->parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x5633,"void nk_group_scrolled_end(struct nk_context *)");
    }
    pnVar3 = pnVar2->parent;
    nk_zero(&panel_padding,0x1d8);
    nVar4 = nk_panel_get_padding(&ctx->style,NK_PANEL_GROUP);
    pan.flags = (nk_flags)((pnVar2->bounds).y - (pnVar2->header_height + (pnVar2->menu).h));
    local_218 = nVar4.x;
    pan.name_string._60_4_ = (pnVar2->bounds).x - local_218;
    pan.bounds.x = local_218 + local_218 + (pnVar2->bounds).w;
    pan.bounds.y = (pnVar2->bounds).h + pnVar2->header_height + (pnVar2->menu).h;
    if ((pnVar2->flags & 1) != 0) {
      pan.name_string._60_4_ = (float)pan.name_string._60_4_ - pnVar2->border;
      pan.flags = (nk_flags)((float)pan.flags - pnVar2->border);
      pan.bounds.x = pnVar2->border + pnVar2->border + pan.bounds.x;
      pan.bounds.y = pnVar2->border + pnVar2->border + pan.bounds.y;
    }
    if ((pnVar2->flags & 0x20) == 0) {
      pan.bounds.x = (ctx->style).window.scrollbar_size.x + pan.bounds.x;
      pan.bounds.y = (ctx->style).window.scrollbar_size.y + pan.bounds.y;
    }
    pan.bounds.w = (float)*pnVar2->offset_x;
    pan.bounds.h = (float)*pnVar2->offset_y;
    pan.name_string._56_4_ = pnVar2->flags;
    pan._96_8_ = (pnVar1->buffer).base;
    pan.buffer.base = *(nk_buffer **)&(pnVar1->buffer).clip;
    pan.buffer.clip.x = (pnVar1->buffer).clip.w;
    pan.buffer.clip.y = (pnVar1->buffer).clip.h;
    pan.buffer.clip.w = (float)(pnVar1->buffer).use_clipping;
    pan.buffer.clip.h = *(float *)&(pnVar1->buffer).field_0x1c;
    pan.buffer._24_8_ = (pnVar1->buffer).userdata;
    pan.buffer.userdata = (nk_handle)(pnVar1->buffer).begin;
    pan.buffer.begin = (pnVar1->buffer).end;
    pan.buffer.end = (pnVar1->buffer).last;
    ctx->current = (nk_window *)&panel_padding;
    pan.buffer.last = (nk_size)pnVar2;
    pan.prev = pnVar1;
    nk_unify((nk_rect *)&pan.parent,&pnVar3->clip,(float)pan.name_string._60_4_,(float)pan.flags,
             (float)pan.name_string._60_4_ + pan.bounds.x,
             (float)pan.flags + pan.bounds.y + local_218);
    nk_push_scissor((nk_command_buffer *)&pan.scrollbar.y,stack0xffffffffffffffc8);
    nk_end(ctx);
    (pnVar1->buffer).end = pan.buffer.begin;
    (pnVar1->buffer).last = pan.buffer.end;
    (pnVar1->buffer).userdata = (nk_handle)pan.buffer._24_8_;
    (pnVar1->buffer).begin = (nk_size)pan.buffer.userdata;
    (pnVar1->buffer).clip.w = pan.buffer.clip.x;
    (pnVar1->buffer).clip.h = pan.buffer.clip.y;
    (pnVar1->buffer).use_clipping = (int)pan.buffer.clip.w;
    *(float *)&(pnVar1->buffer).field_0x1c = pan.buffer.clip.h;
    (pnVar1->buffer).base = (nk_buffer *)pan._96_8_;
    *(nk_buffer **)&(pnVar1->buffer).clip = pan.buffer.base;
    nk_push_scissor(&pnVar1->buffer,pnVar3->clip);
    ctx->current = pnVar1;
    pnVar1->layout = pnVar3;
    (pnVar2->bounds).x = (float)pan.name_string._60_4_;
    (pnVar2->bounds).y = (float)pan.flags;
    (pnVar2->bounds).w = pan.bounds.x;
    (pnVar2->bounds).h = pan.bounds.y;
  }
  return;
}

Assistant:

NK_API void
nk_group_scrolled_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *parent;
    struct nk_panel *g;

    struct nk_rect clip;
    struct nk_window pan;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return;

    /* make sure nk_group_begin was called correctly */
    NK_ASSERT(ctx->current);
    win = ctx->current;
    NK_ASSERT(win->layout);
    g = win->layout;
    NK_ASSERT(g->parent);
    parent = g->parent;

    /* dummy window */
    nk_zero_struct(pan);
    panel_padding = nk_panel_get_padding(&ctx->style, NK_PANEL_GROUP);
    pan.bounds.y = g->bounds.y - (g->header_height + g->menu.h);
    pan.bounds.x = g->bounds.x - panel_padding.x;
    pan.bounds.w = g->bounds.w + 2 * panel_padding.x;
    pan.bounds.h = g->bounds.h + g->header_height + g->menu.h;
    if (g->flags & NK_WINDOW_BORDER) {
        pan.bounds.x -= g->border;
        pan.bounds.y -= g->border;
        pan.bounds.w += 2*g->border;
        pan.bounds.h += 2*g->border;
    }
    if (!(g->flags & NK_WINDOW_NO_SCROLLBAR)) {
        pan.bounds.w += ctx->style.window.scrollbar_size.x;
        pan.bounds.h += ctx->style.window.scrollbar_size.y;
    }
    pan.scrollbar.x = *g->offset_x;
    pan.scrollbar.y = *g->offset_y;
    pan.flags = g->flags;
    pan.buffer = win->buffer;
    pan.layout = g;
    pan.parent = win;
    ctx->current = &pan;

    /* make sure group has correct clipping rectangle */
    nk_unify(&clip, &parent->clip, pan.bounds.x, pan.bounds.y,
        pan.bounds.x + pan.bounds.w, pan.bounds.y + pan.bounds.h + panel_padding.x);
    nk_push_scissor(&pan.buffer, clip);
    nk_end(ctx);

    win->buffer = pan.buffer;
    nk_push_scissor(&win->buffer, parent->clip);
    ctx->current = win;
    win->layout = parent;
    g->bounds = pan.bounds;
    return;
}